

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkperfevents.cpp
# Opt level: O2

QList<QBenchmarkMeasurerBase::Measurement> * __thiscall
QBenchmarkPerfEventsMeasurer::stop
          (QList<QBenchmarkMeasurerBase::Measurement> *__return_storage_ptr__,
          QBenchmarkPerfEventsMeasurer *this)

{
  Type *pTVar1;
  pointer pMVar2;
  long lVar3;
  qsizetype i;
  ulong idx;
  Measurement MVar4;
  
  prctl(0x1f);
  pTVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_eventTypes>_>::instance
                     ();
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (Measurement *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QBenchmarkMeasurerBase::Measurement>::QList
            (__return_storage_ptr__,(pTVar1->d).size,Uninitialized);
  lVar3 = 8;
  for (idx = 0; idx < (ulong)(pTVar1->d).size; idx = idx + 1) {
    MVar4 = readValue(this,idx);
    pMVar2 = QList<QBenchmarkMeasurerBase::Measurement>::data(__return_storage_ptr__);
    *(qreal *)((long)pMVar2 + lVar3 + -8) = MVar4.value;
    *(QBenchmarkMetric *)((long)&pMVar2->value + lVar3) = MVar4.metric;
    lVar3 = lVar3 + 0x10;
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QBenchmarkMeasurerBase::Measurement> QBenchmarkPerfEventsMeasurer::stop()
{
    // disable the counters
    prctl(PR_TASK_PERF_EVENTS_DISABLE);

    const QList<PerfEvent> &counters = *eventTypes;
    QList<Measurement> result(counters.size(), {});
    for (qsizetype i = 0; i < counters.size(); ++i) {
        result[i] = readValue(i);
    }
    return result;
}